

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O0

int uv__epoll_pwait(int epfd,uv__epoll_event *events,int nevents,int timeout,uint64_t sigmask)

{
  long lVar1;
  uint64_t uStack_28;
  int result;
  uint64_t sigmask_local;
  int timeout_local;
  int nevents_local;
  uv__epoll_event *events_local;
  int epfd_local;
  
  uStack_28 = sigmask;
  sigmask_local._0_4_ = timeout;
  sigmask_local._4_4_ = nevents;
  _timeout_local = events;
  events_local._4_4_ = epfd;
  lVar1 = syscall(0x119,(ulong)(uint)epfd,events,(ulong)(uint)nevents,(ulong)(uint)timeout,
                  &stack0xffffffffffffffd8,8);
  return (int)lVar1;
}

Assistant:

int uv__epoll_pwait(int epfd,
                    struct uv__epoll_event* events,
                    int nevents,
                    int timeout,
                    uint64_t sigmask) {
#if defined(__NR_epoll_pwait)
  int result;
  result = syscall(__NR_epoll_pwait,
                   epfd,
                   events,
                   nevents,
                   timeout,
                   &sigmask,
                   sizeof(sigmask));
#if MSAN_ACTIVE
  if (result > 0)
    __msan_unpoison(events, sizeof(events[0]) * result);
#endif
  return result;
#else
  return errno = ENOSYS, -1;
#endif
}